

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_KILL_TRAP(project_feature_handler_context_t *context)

{
  loc grid;
  _Bool _Var1;
  
  grid = context->grid;
  _Var1 = square_issecretdoor(cave,grid);
  if (_Var1) {
    place_closed_door(cave,(loc_conflict)grid);
    _Var1 = square_isseen(cave,grid);
    if (_Var1) {
      context->obvious = true;
    }
  }
  _Var1 = square_isdisarmabletrap(cave,grid);
  if (_Var1) {
    _Var1 = square_isseen(cave,grid);
    if (_Var1) {
      msg("The trap seizes up.");
      context->obvious = true;
    }
    square_disable_trap(cave,grid);
    return;
  }
  _Var1 = square_islockeddoor(cave,grid);
  if (_Var1) {
    square_unlock_door(cave,grid);
    _Var1 = square_isview(cave,grid);
    if (_Var1) {
      msg("Click!");
      context->obvious = true;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_KILL_TRAP(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Reveal secret doors */
	if (square_issecretdoor(cave, grid)) {
		place_closed_door(cave, grid);

		/* Check if visible */
		if (square_isseen(cave, grid))
			context->obvious = true;
	}

	/* Disable traps, unlock doors */
	if (square_isdisarmabletrap(cave, grid)) {
		/* Check if visible */
		if (square_isseen(cave, grid)) {
			msg("The trap seizes up.");
			context->obvious = true;
		}

		/* Disable the trap */
		square_disable_trap(cave, grid);
	} else if (square_islockeddoor(cave, grid)) {
		/* Unlock the door */
		square_unlock_door(cave, grid);

		/* Check line of sound; approximated with square_isview() */
		if (square_isview(cave, grid)) {
			msg("Click!");
			context->obvious = true;
		}
	}
}